

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcommandlineoption.cpp
# Opt level: O0

QStringList * QCommandLineOptionPrivate::removeInvalidNames(QStringList *nameList)

{
  long lVar1;
  bool bVar2;
  QList<QString> *in_RSI;
  QStringList *in_RDI;
  long in_FS_OFFSET;
  QStringList *this;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this = in_RDI;
  bVar2 = QList<QString>::isEmpty((QList<QString> *)0x1f7e7d);
  if (!bVar2) {
    QList<QString>::removeIf<(anonymous_namespace)::IsInvalidName>(in_RSI);
  }
  QList<QString>::QList(this,in_RSI);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return in_RDI;
  }
  __stack_chk_fail();
}

Assistant:

QStringList QCommandLineOptionPrivate::removeInvalidNames(QStringList nameList)
{
    if (Q_UNLIKELY(nameList.isEmpty()))
        qWarning("QCommandLineOption: Options must have at least one name");
    else
        nameList.removeIf(IsInvalidName());
    return nameList;
}